

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void __thiscall FStateDefinitions::AddStateLabel(FStateDefinitions *this,char *statename)

{
  uint uVar1;
  FStateDefine *pFVar2;
  FStateDefine *std;
  intptr_t index;
  char *statename_local;
  FStateDefinitions *this_local;
  
  uVar1 = TArray<FState,_FState>::Size(&this->StateArray);
  pFVar2 = FindStateAddress(this,statename);
  pFVar2->State = (FState *)((ulong)uVar1 + 1);
  pFVar2->DefineFlags = '\x05';
  this->laststate = (FState *)0x0;
  this->lastlabel = (ulong)uVar1;
  return;
}

Assistant:

void FStateDefinitions::AddStateLabel(const char *statename)
{
	intptr_t index = StateArray.Size();
	FStateDefine *std = FindStateAddress(statename);
	std->State = (FState *)(index+1);
	std->DefineFlags = SDF_INDEX;
	laststate = NULL;
	lastlabel = index;
}